

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * Splash_abi_cxx11_(void)

{
  int iVar1;
  rep rVar2;
  result_type rVar3;
  string *in_RDI;
  uint index;
  uint seed;
  default_random_engine randomizer;
  result_type in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  undefined4 local_14;
  
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x10aa65);
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_28);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  local_14 = (undefined4)rVar2;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::seed
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)in_RDI,
             in_stack_ffffffffffffff88);
  rVar3 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)in_RDI
                    );
  iVar1 = (int)rVar3 + (int)(rVar3 / 7) * -7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  return in_RDI;
}

Assistant:

std::string Splash()
{
    std::default_random_engine randomizer;
    unsigned seed = (unsigned) std::chrono::system_clock::now().time_since_epoch().count();
    randomizer.seed(seed);
    unsigned index = randomizer() % (sizeof(splashes) / sizeof(const char*));
    return std::string(splashes[index]);
}